

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O1

void __thiscall Polynom<Complex>::Polynom(Polynom<Complex> *this,Complex *f)

{
  Complex *this_00;
  
  Matrix<Complex>::Matrix(&this->m,1,1);
  this_00 = (this->m).arr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)f);
  (this_00->_re)._numerator.negative = (f->_re)._numerator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this_00->_re)._denominator.digits,&(f->_re)._denominator.digits);
  (this_00->_re)._denominator.negative = (f->_re)._denominator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this_00->_im,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f->_im);
  (this_00->_im)._numerator.negative = (f->_im)._numerator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this_00->_im)._denominator.digits,&(f->_im)._denominator.digits);
  (this_00->_im)._denominator.negative = (f->_im)._denominator.negative;
  return;
}

Assistant:

explicit Polynom(const Field &f): m(1, 1)
    {
        m[0][0] = f;
    }